

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda.c
# Opt level: O0

void xc_lda_vxc_fxc_kxc(xc_func_type *p,size_t np,double *rho,double *vrho,double *v2rho2,
                       double *v3rho3)

{
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  xc_lda_out_params out;
  xc_lda_out_params *in_stack_000001d0;
  double *in_stack_000001d8;
  size_t in_stack_000001e0;
  int in_stack_000001ec;
  xc_func_type *in_stack_000001f0;
  undefined1 auStack_58 [8];
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  memset(auStack_58,0,0x28);
  local_50 = local_20;
  local_48 = local_28;
  local_40 = local_30;
  xc_lda_new(in_stack_000001f0,in_stack_000001ec,in_stack_000001e0,in_stack_000001d8,
             in_stack_000001d0);
  return;
}

Assistant:

void
xc_lda_vxc_fxc_kxc(const xc_func_type *p, size_t np, const double *rho, double *vrho, double *v2rho2, double *v3rho3)
{
  xc_lda_out_params out;
  libxc_memset(&out, 0, sizeof(xc_lda_out_params));
  out.vrho   = vrho;
  out.v2rho2 = v2rho2;
  out.v3rho3 = v3rho3;

  xc_lda_new(p, 3, np, rho, &out);
}